

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O0

void __thiscall
AllReduceSockets::AllReduceSockets
          (AllReduceSockets *this,string *pspan_server,int pport,size_t punique_id,size_t ptotal,
          size_t pnode)

{
  size_t in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  AllReduce *in_RDI;
  size_t in_R8;
  size_t in_R9;
  node_socks *in_stack_ffffffffffffffc0;
  
  AllReduce::AllReduce(in_RDI,in_R8,in_R9);
  in_RDI->_vptr_AllReduce = (_func_int **)&PTR__AllReduceSockets_0048cd90;
  node_socks::node_socks(in_stack_ffffffffffffffc0);
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  *(undefined4 *)&in_RDI[4].total = in_EDX;
  in_RDI[4].node = in_RCX;
  return;
}

Assistant:

AllReduceSockets(std::string pspan_server, const int pport, const size_t punique_id, size_t ptotal, const size_t pnode)
      : AllReduce(ptotal, pnode), span_server(pspan_server), port(pport), unique_id(punique_id)
  {
  }